

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsRoberts_ASAi_dns.c
# Opt level: O3

void PrintOutput(sunrealtype tfinal,N_Vector y,N_Vector yB,N_Vector qB)

{
  undefined8 *puVar1;
  ulong *puVar2;
  
  puts("--------------------------------------------------------");
  printf("returned t: %12.4e\n",tfinal);
  puVar1 = *(undefined8 **)((long)yB->content + 0x10);
  printf("lambda(t0): %12.4e %12.4e %12.4e\n",*puVar1,puVar1[1],puVar1[2]);
  puVar1 = *(undefined8 **)((long)y->content + 0x10);
  printf("y(t0):      %12.4e %12.4e %12.4e\n",*puVar1,puVar1[1],puVar1[2]);
  puVar2 = *(ulong **)((long)qB->content + 0x10);
  printf("dG/dp:      %12.4e %12.4e %12.4e\n",*puVar2 ^ 0x8000000000000000,
         puVar2[1] ^ 0x8000000000000000,puVar2[2] ^ 0x8000000000000000);
  puts("--------------------------------------------------------");
  return;
}

Assistant:

static void PrintOutput(sunrealtype tfinal, N_Vector y, N_Vector yB, N_Vector qB)
{
  printf("--------------------------------------------------------\n");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("returned t: %12.4Le\n", tfinal);
  printf("lambda(t0): %12.4Le %12.4Le %12.4Le\n", Ith(yB, 1), Ith(yB, 2),
         Ith(yB, 3));
  printf("y(t0):      %12.4Le %12.4Le %12.4Le\n", Ith(y, 1), Ith(y, 2),
         Ith(y, 3));
  printf("dG/dp:      %12.4Le %12.4Le %12.4Le\n", -Ith(qB, 1), -Ith(qB, 2),
         -Ith(qB, 3));
#elif defined(SUNDIALS_DOUBLE_PRECISION)
  printf("returned t: %12.4e\n", tfinal);
  printf("lambda(t0): %12.4e %12.4e %12.4e\n", Ith(yB, 1), Ith(yB, 2),
         Ith(yB, 3));
  printf("y(t0):      %12.4e %12.4e %12.4e\n", Ith(y, 1), Ith(y, 2), Ith(y, 3));
  printf("dG/dp:      %12.4e %12.4e %12.4e\n", -Ith(qB, 1), -Ith(qB, 2),
         -Ith(qB, 3));
#else
  printf("returned t: %12.4e\n", tfinal);
  printf("lambda(t0): %12.4e %12.4e %12.4e\n", Ith(yB, 1), Ith(yB, 2),
         Ith(yB, 3));
  printf("y(t0)     : %12.4e %12.4e %12.4e\n", Ith(y, 1), Ith(y, 2), Ith(y, 3));
  printf("dG/dp:      %12.4e %12.4e %12.4e\n", -Ith(qB, 1), -Ith(qB, 2),
         -Ith(qB, 3));
#endif
  printf("--------------------------------------------------------\n");
}